

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O0

QString * QSqlQueryModelSql::from(QString *s)

{
  long lVar1;
  QLatin1StringView latin1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QString *in_stack_ffffffffffffffe0;
  QString *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = from();
  latin1.m_data = (char *)in_stack_ffffffffffffffe8;
  latin1.m_size = (qsizetype)in_stack_ffffffffffffffe0;
  QString::QString((QString *)QVar2.m_size,latin1);
  concat(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QString::~QString((QString *)0x15d622);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString from(const QString &s) { return concat(from(), s); }